

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_dmc.c
# Opt level: O0

void NES_DMC_np_Reset(void *chip)

{
  uint uVar1;
  undefined4 local_1c;
  int i;
  NES_DMC *dmc;
  void *chip_local;
  
  InitializeTNDTable((NES_DMC *)chip,8227.0,12241.0,22638.0);
  *(undefined4 *)((long)chip + 0x400b0) = 0;
  *(undefined4 *)((long)chip + 0x400b4) = 0;
  *(undefined4 *)((long)chip + 0x400b8) = 0;
  *(undefined4 *)((long)chip + 0x400bc) = 0;
  *(undefined4 *)((long)chip + 0x400c0) = 4;
  *(undefined4 *)((long)chip + 0x400c4) = 0x1ac;
  *(undefined4 *)((long)chip + 0x400c8) = 0;
  *(undefined4 *)((long)chip + 0x400cc) = 0;
  *(undefined4 *)((long)chip + 0x400d0) = 0;
  *(undefined1 *)((long)chip + 0x400d4) = 0;
  *(undefined1 *)((long)chip + 0x400d5) = 0;
  *(undefined4 *)((long)chip + 0x400d8) = 0;
  *(undefined4 *)((long)chip + 0x400dc) = 0;
  *(undefined4 *)((long)chip + 0x400e0) = 0;
  *(undefined1 *)((long)chip + 0x400e4) = 0;
  *(undefined1 *)((long)chip + 0x400e5) = 0;
  *(undefined1 *)((long)chip + 0x400e6) = 0;
  *(undefined4 *)((long)chip + 0x400e8) = 0;
  *(undefined4 *)((long)chip + 0x400ec) = 0;
  *(undefined4 *)((long)chip + 0x400f0) = 0;
  *(undefined1 *)((long)chip + 0x400f4) = 0;
  *(undefined1 *)((long)chip + 0x400f5) = 0;
  *(undefined4 *)((long)chip + 0x400f8) = 0;
  *(undefined4 *)((long)chip + 0x400fc) = 0;
  *(undefined1 *)((long)chip + 0x40118) = 0;
  *(undefined1 *)((long)chip + 0x40119) = 0;
  *(undefined4 *)((long)chip + 0x40108) = 0;
  *(undefined4 *)((long)chip + 0x40114) = 4;
  *(undefined4 *)((long)chip + 0x40110) = 0;
  for (local_1c = 0; local_1c < 0xf; local_1c = local_1c + 1) {
    NES_DMC_np_Write(chip,(short)local_1c + 0x4008,'\0');
  }
  NES_DMC_np_Write(chip,0x4017,'@');
  *(undefined1 *)((long)chip + 0x400ac) = 0;
  NES_DMC_np_Write(chip,0x4015,'\0');
  if (*(int *)((long)chip + 0x40008) != 0) {
    NES_DMC_np_Write(chip,0x4015,'\x0f');
  }
  *(undefined4 *)((long)chip + 0x40078) = 0;
  *(undefined4 *)((long)chip + 0x40074) = 0;
  *(undefined4 *)((long)chip + 0x40070) = 0;
  *(undefined2 *)((long)chip + 0x4008a) = 0;
  *(undefined1 *)((long)chip + 0x40090) = 0;
  *(undefined4 *)((long)chip + 0x40094) = 0;
  *(undefined4 *)((long)chip + 0x40098) = 0;
  *(undefined4 *)((long)chip + 0x4008c) = 0;
  *(undefined4 *)((long)chip + 0x40084) = 0x100;
  *(undefined1 *)((long)chip + 0x40088) = 1;
  *(undefined4 *)((long)chip + 0x40060) = 0;
  *(undefined4 *)((long)chip + 0x40080) = 0;
  *(undefined4 *)((long)chip + 0x4005c) = 0;
  *(undefined4 *)((long)chip + 0x4007c) = 0;
  *(undefined4 *)((long)chip + 0x400dc) = 1;
  *(undefined4 *)((long)chip + 0x400e0) = 2;
  if (*(int *)((long)chip + 0x4001c) != 0) {
    uVar1 = rand();
    *(uint *)((long)chip + 0x400dc) = uVar1 | *(uint *)((long)chip + 0x400dc);
    uVar1 = rand();
    *(uint *)((long)chip + 0x400b4) = -(uVar1 & 0x1ff);
  }
  if (*(int *)((long)chip + 0x40028) != 0) {
    uVar1 = rand();
    *(uint *)((long)chip + 0x400bc) = uVar1 & 0x1f;
    uVar1 = rand();
    *(uint *)((long)chip + 0x400b0) = -(uVar1 & 0x7ff);
  }
  NES_DMC_np_SetRate(chip,*(UINT32 *)((long)chip + 0x400a0));
  RC_RESET((RATIO_CNTR *)((long)chip + 0x40120));
  return;
}

Assistant:

void NES_DMC_np_Reset(void* chip)
{
	NES_DMC* dmc = (NES_DMC*)chip;
	int i;
	//dmc->mask = 0;

	InitializeTNDTable(dmc,8227,12241,22638);

	dmc->counter[0] = 0;
	dmc->counter[1] = 0;
	dmc->counter[2] = 0;
	dmc->tphase = 0;
	dmc->nfreq = wavlen_table[0][0];
	dmc->dfreq = freq_table[0][0];
	dmc->tri_freq = 0;
	dmc->linear_counter = 0;
	dmc->linear_counter_reload = 0;
	dmc->linear_counter_halt = 0;
	dmc->linear_counter_control = 0;
	dmc->noise_volume = 0;
	dmc->noise = 0;
	dmc->noise_tap = 0;
	dmc->envelope_loop = 0;
	dmc->envelope_disable = 0;
	dmc->envelope_write = 0;
	dmc->envelope_div_period = 0;
	dmc->envelope_div = 0;
	dmc->envelope_counter = 0;
	dmc->enable[0] = 0;
	dmc->enable[1] = 0;
	dmc->length_counter[0] = 0;
	dmc->length_counter[1] = 0;
	dmc->frame_irq = false;
	dmc->frame_irq_enable = false;
	dmc->frame_sequence_count = 0;
	dmc->frame_sequence_steps = 4;
	dmc->frame_sequence_step = 0;
	//cpu->UpdateIRQ(NES_CPU::IRQD_FRAME, false);

	for (i = 0; i < 0x0F; i++)
		NES_DMC_np_Write (dmc, 0x4008 + i, 0);
	NES_DMC_np_Write (dmc, 0x4017, 0x40);

	dmc->irq = false;
	NES_DMC_np_Write (dmc, 0x4015, 0x00);
	if (dmc->option[OPT_UNMUTE_ON_RESET])
		NES_DMC_np_Write (dmc, 0x4015, 0x0f);
	//cpu->UpdateIRQ(NES_CPU::IRQD_DMC, false);

	dmc->out[0] = dmc->out[1] = dmc->out[2] = 0;
	dmc->damp = 0;
	dmc->dmc_pop = false;
	dmc->dmc_pop_offset = 0;
	dmc->dmc_pop_follow = 0;
	dmc->dac_lsb = 0;
	dmc->data = 0x100;
	dmc->empty = true;
	dmc->adr_reg = 0;
	dmc->dlength = 0;
	dmc->len_reg = 0;
	dmc->daddress = 0;
	dmc->noise = 1;
	dmc->noise_tap = (1<<1);

	if (dmc->option[OPT_RANDOMIZE_NOISE])
	{
		dmc->noise |= rand();
		dmc->counter[1] = -(rand() & 511);
	}
	if (dmc->option[OPT_RANDOMIZE_TRI])
	{
		dmc->tphase = rand() & 31;
		dmc->counter[0] = -(rand() & 2047);
	}

	NES_DMC_np_SetRate(dmc, dmc->rate);
	RC_RESET(&dmc->tick_count);
}